

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O3

void __thiscall
cpptrace::stacktrace::print
          (stacktrace *this,ostream *stream,bool color,bool newline_at_end,char *header)

{
  pointer psVar1;
  bool bVar2;
  uint uVar3;
  int *piVar4;
  size_t sVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  const_iterator __end1;
  const_iterator __begin1;
  pointer frame;
  uint frame_number_width;
  char *__s;
  size_t counter;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *__range1;
  char local_3e [2];
  undefined4 local_3c;
  stacktrace *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,newline_at_end);
  local_38 = this;
  if ((int)CONCAT71(in_register_00000011,color) != 0) {
    if (stream == (ostream *)&std::cout) {
      piVar4 = &stdout_fileno;
    }
    else {
      if (stream != (ostream *)&std::cerr) goto LAB_00174045;
      piVar4 = &stderr_fileno;
    }
    ::isatty(*piVar4);
  }
LAB_00174045:
  __s = "Stack trace (most recent call first):";
  if (header != (char *)0x0) {
    __s = header;
  }
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar5);
  local_3e[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_3e + 1,1);
  frame = (local_38->frames).
          super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
          ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (local_38->frames).
           super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (frame == psVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"<empty trace>\n",0xe);
  }
  else {
    uVar3 = (int)((ulong)((long)psVar1 - (long)frame) >> 5) * -0x55555555 - 1;
    frame_number_width = 1;
    if (9 < uVar3) {
      do {
        frame_number_width = frame_number_width + 1;
        bVar2 = 99 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar2);
    }
    counter = 0;
    do {
      print_frame(stream,color,frame_number_width,counter,frame);
      if (((char)local_3c != '\0') ||
         (frame != (local_38->frames).
                   super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1)) {
        local_3e[0] = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(stream,local_3e,1);
      }
      counter = counter + 1;
      frame = frame + 1;
    } while (frame != psVar1);
  }
  return;
}

Assistant:

void stacktrace::print(std::ostream& stream, bool color, bool newline_at_end, const char* header) const {
        if(
            color && (
                (&stream == &std::cout && isatty(stdout_fileno)) || (&stream == &std::cerr && isatty(stderr_fileno))
            )
        ) {
            detail::enable_virtual_terminal_processing_if_needed();
        }
        stream << (header ? header : "Stack trace (most recent call first):") << '\n';
        std::size_t counter = 0;
        if(frames.empty()) {
            stream << "<empty trace>\n";
            return;
        }
        const auto frame_number_width = detail::n_digits(static_cast<int>(frames.size()) - 1);
        for(const auto& frame : frames) {
            print_frame(stream, color, frame_number_width, counter, frame);
            if(newline_at_end || &frame != &frames.back()) {
                stream << '\n';
            }
            counter++;
        }
    }